

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> *
rcg::System::getSystems(void)

{
  __type _Var1;
  char *pcVar2;
  System *this;
  ostream *poVar3;
  GenTLException *this_00;
  char *extraout_RDX;
  char *extraout_RDX_00;
  long lVar4;
  size_t i;
  ulong uVar5;
  vector<std::shared_ptr<rcg::System>,std::allocator<std::shared_ptr<rcg::System>>> *in_RDI;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream info;
  
  std::recursive_mutex::lock((recursive_mutex *)(anonymous_namespace)::system_mtx);
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  pcVar2 = extraout_RDX;
  if (_DAT_00149280 == 0) {
    pcVar2 = getenv("GENICAM_GENTL64_PATH");
    setSystemsPath(pcVar2,(char *)0x0);
    pcVar2 = extraout_RDX_00;
  }
  getAvailableGenTLs_abi_cxx11_(&name,(anonymous_namespace)::system_path_abi_cxx11_,pcVar2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&info);
  uVar6 = 0;
  do {
    if ((ulong)((long)name.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)name.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6) {
      std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
      operator=((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                 *)&(anonymous_namespace)::system_list,
                (vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                 *)in_RDI);
      if (*(long *)(in_RDI + 8) != *(long *)in_RDI) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&info);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&name);
        pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::system_mtx);
        return (vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                *)in_RDI;
      }
      poVar3 = std::operator<<((ostream *)&info,"No transport layers found in path: ");
      std::operator<<(poVar3,(string *)&(anonymous_namespace)::system_path_abi_cxx11_);
      this_00 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      GenTLException::GenTLException(this_00,&local_1c8);
      __cxa_throw(this_00,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    __rhs = name.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + uVar6;
    lVar4 = 0;
    for (uVar5 = 0; uVar5 < (ulong)(DAT_00149268 - (anonymous_namespace)::system_list >> 4);
        uVar5 = uVar5 + 1) {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)((anonymous_namespace)::system_list + lVar4) + 0x10),__rhs);
      if (_Var1) goto LAB_0011cb2e;
      lVar4 = lVar4 + 0x10;
    }
    uVar5 = 0xffffffff;
LAB_0011cb2e:
    if (((anonymous_namespace)::system_ignore_abi_cxx11_._8_8_ == 0) ||
       (name.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_string_length <
        (ulong)(anonymous_namespace)::system_ignore_abi_cxx11_._8_8_)) {
LAB_0011cb76:
      if ((int)uVar5 < 0) {
        this = (System *)operator_new(0xb0);
        System(this,name.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar6);
        std::__shared_ptr<rcg::System,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::System,void>
                  ((__shared_ptr<rcg::System,(__gnu_cxx::_Lock_policy)2> *)&local_1c8,this);
        std::vector<std::shared_ptr<rcg::System>,std::allocator<std::shared_ptr<rcg::System>>>::
        emplace_back<std::shared_ptr<rcg::System>>(in_RDI,(shared_ptr<rcg::System> *)&local_1c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c8._M_string_length);
      }
      else {
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        push_back((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                   *)in_RDI,
                  (value_type *)((uVar5 & 0xffffffff) * 0x10 + (anonymous_namespace)::system_list));
      }
    }
    else {
      std::__cxx11::string::substr
                ((ulong)&local_1c8,
                 (ulong)(name.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar6));
      _Var1 = std::operator==(&local_1c8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (anonymous_namespace)::system_ignore_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1c8);
      if (!_Var1) goto LAB_0011cb76;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

std::vector<std::shared_ptr<System> > System::getSystems()
{
  std::lock_guard<std::recursive_mutex> lock(system_mtx);
  std::vector<std::shared_ptr<System> > ret;

  // ensure that system_path is defined

  if (system_path.size() == 0)
  {
    const char *env=0;
    if (sizeof(size_t) == 8)
    {
      env="GENICAM_GENTL64_PATH";
    }
    else
    {
      env="GENICAM_GENTL32_PATH";
    }

    setSystemsPath(std::getenv(env), 0);
  }

  // get list of all available transport layer libraries

  std::vector<std::string> name=getAvailableGenTLs(system_path.c_str());
  std::ostringstream info;

  // create list of systems according to the list, using either existing
  // systems or instantiating new ones

  for (size_t i=0; i<name.size(); i++)
  {
    int k=find(system_list, name[i]);

    if (system_ignore.size() > 0)
    {
      // skipping if name equals ignore

      if (name[i].size() >= system_ignore.size() &&
          name[i].substr(name[i].size()-system_ignore.size()) == system_ignore)
      {
        continue;
      }
    }

    if (k >= 0)
    {
      ret.push_back(system_list[static_cast<size_t>(k)]);
    }
    else
    {
      try
      {
        System *p=new System(name[i]);
        ret.push_back(std::shared_ptr<System>(p));
      }
      catch (const std::exception &ex)
      {
        // ignore transport layers that cannot be used, but collect reason
        // for failure

        info << ex.what() << std::endl;
      }
    }
  }

  // remember returned list for reusing existing systems on the next call

  system_list=ret;

  // throw exception if no transport layers are available

  if (ret.size() == 0)
  {
    info << "No transport layers found in path: " << system_path;
    throw GenTLException(info.str());
  }

  return ret;
}